

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorRasterizerTests.cpp
# Opt level: O0

void __thiscall
agge::tests::VectorRasterizerTests::CellsAreSortedAfterCompacting(VectorRasterizerTests *this)

{
  bool value;
  cells_container *actual;
  allocator local_191;
  string local_190 [32];
  LocationInfo local_170;
  allocator local_141;
  string local_140 [32];
  LocationInfo local_120;
  undefined1 auStack_f8 [8];
  cell reference [9];
  undefined1 local_88 [8];
  vector_rasterizer vr;
  VectorRasterizerTests *this_local;
  
  vr._112_8_ = this;
  vector_rasterizer::vector_rasterizer((vector_rasterizer *)local_88);
  anon_unknown_5::rectangle((vector_rasterizer *)local_88,2.0,1.0,5.0,5.0);
  vector_rasterizer::compact((vector_rasterizer *)local_88);
  reference[7].y = 5;
  reference[7].area = 5;
  reference[7].cover = 0;
  reference[8].x = 0;
  reference._56_8_ = 0x5ff0000000000;
  reference[6].area._0_2_ = 4;
  reference._66_6_ = 0x10000000000;
  reference[4].x = -0x100;
  reference[4].y = 5;
  reference[4].area = 3;
  reference._48_8_ = 0x4000201000000;
  reference[2].area = 2;
  reference[2].cover = 0;
  reference[3].x = 0x100;
  reference[3].y = 2;
  reference[3].area = 3;
  reference[3].cover = 0;
  reference._8_8_ = 0x2000201000000;
  reference._16_8_ = 0x5ff0000000000;
  auStack_f8._0_2_ = 2;
  auStack_f8._2_2_ = 1;
  auStack_f8._4_4_ = 0;
  reference[0].x = -0x100;
  reference[0].y = 5;
  reference[0].area = 1;
  value = vector_rasterizer::sorted((vector_rasterizer *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_140,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_141);
  ut::LocationInfo::LocationInfo(&local_120,(string *)local_140,0x5f7);
  ut::is_true(value,&local_120);
  ut::LocationInfo::~LocationInfo(&local_120);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  actual = vector_rasterizer::cells((vector_rasterizer *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_191);
  ut::LocationInfo::LocationInfo(&local_170,(string *)local_190,0x5f8);
  ut::are_equal<agge::vector_rasterizer::cell,9ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [9])auStack_f8,actual,&local_170);
  ut::LocationInfo::~LocationInfo(&local_170);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  vector_rasterizer::~vector_rasterizer((vector_rasterizer *)local_88);
  return;
}

Assistant:

test( CellsAreSortedAfterCompacting )
			{
				// INIT
				vector_rasterizer vr;

				// ACT
				rectangle(vr, 2, 1, 5, 5);
				vr.compact();

				// ASSERT
				vector_rasterizer::cell reference[] = {
					{ 2, 1, 0, -256 }, { 5, 1, 0, 256 },
					{ 2, 2, 0, -256 }, { 5, 2, 0, 256 },
					{ 2, 3, 0, -256 }, { 5, 3, 0, 256 },
					{ 2, 4, 0, -256 }, { 5, 4, 0, 256 },
					{ 5, 5, 0, 0 },
				};

				assert_is_true(vr.sorted());
				assert_equal(reference, vr.cells());
			}